

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

string * __thiscall
bloaty::anon_unknown_35::LeftPad
          (string *__return_storage_ptr__,anon_unknown_35 *this,string *input,size_t size)

{
  string *extraout_RAX;
  string *psVar1;
  string *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&input->_M_dataplus);
  psVar1 = extraout_RAX;
  if (__return_storage_ptr__->_M_string_length < size) {
    do {
      std::operator+(&local_50," ",__return_storage_ptr__);
      psVar1 = (string *)
               std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        psVar1 = extraout_RAX_00;
      }
    } while (__return_storage_ptr__->_M_string_length < size);
  }
  return psVar1;
}

Assistant:

std::string LeftPad(const std::string& input, size_t size) {
  std::string ret = input;
  while (ret.size() < size) {
    ret = " " + ret;
  }

  return ret;
}